

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O2

hrgls_MessageLevel __thiscall hrgls::Message::Level(Message *this)

{
  hrgls_Message phVar1;
  uint in_EAX;
  hrgls_Status hVar2;
  hrgls_MessageLevel ret;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  phVar1 = this->m_private->Message;
  if (phVar1 == (hrgls_Message)0x0) {
    this->m_private->status = 0x3ee;
    uStack_18._4_4_ = 0;
  }
  else {
    hVar2 = hrgls_MessageGetLevel(phVar1,(long)&uStack_18 + 4);
    this->m_private->status = hVar2;
  }
  return uStack_18._4_4_;
}

Assistant:

hrgls_MessageLevel Message::Level() const
  {
	  hrgls_MessageLevel ret = {};
	  if (!m_private->Message) {
		  m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
		  return ret;
	  }
	  m_private->status = hrgls_MessageGetLevel(m_private->Message, &ret);
	  return ret;
  }